

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O3

void llvm::logAllUnhandledErrors(Error *E,raw_ostream *OS,Twine ErrorBanner)

{
  _func_int *p_Var1;
  char cVar2;
  ulong uVar3;
  ErrorInfoBase *pEVar4;
  anon_class_8_1_3fcf62a2 aVar5;
  Error EVar6;
  _func_int *p_Var7;
  Error local_68;
  raw_ostream *local_60;
  Error local_58;
  anon_class_8_1_3fcf62a2 local_50;
  anon_class_8_1_3fcf62a2 local_48;
  pointer local_40;
  Error local_38;
  
  uVar3 = (ulong)E->Payload & 0xfffffffffffffffe;
  E->Payload = (ErrorInfoBase *)(uVar3 != 0 | uVar3);
  if (uVar3 == 0) {
    return;
  }
  Twine::print(&ErrorBanner,OS);
  pEVar4 = E->Payload;
  E->Payload = (ErrorInfoBase *)0x0;
  aVar5.OS = (raw_ostream *)((ulong)pEVar4 & 0xfffffffffffffffe);
  local_60 = OS;
  if (aVar5.OS == (raw_ostream *)0x0) {
    local_38.Payload = (ErrorInfoBase *)0x1;
  }
  else {
    cVar2 = (**(code **)(*(_func_int **)aVar5.OS + 0x30))(aVar5.OS);
    if (cVar2 == '\0') {
      local_48.OS = aVar5.OS;
      handleErrorImpl<llvm::logAllUnhandledErrors(llvm::Error,llvm::raw_ostream&,llvm::Twine)::__0>
                ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                 &local_38,&local_48);
      if (local_48.OS == (raw_ostream *)0x0) goto LAB_00d95306;
      pEVar4 = (ErrorInfoBase *)(local_48.OS)->_vptr_raw_ostream;
      aVar5.OS = local_48.OS;
    }
    else {
      local_38.Payload = (ErrorInfoBase *)0x1;
      p_Var7 = *(_func_int **)((long)aVar5.OS + 8);
      p_Var1 = *(_func_int **)((long)aVar5.OS + 0x10);
      EVar6.Payload = local_38.Payload;
      if (p_Var7 != p_Var1) {
        EVar6.Payload = (ErrorInfoBase *)0x1;
        local_40 = (pointer)aVar5.OS;
        do {
          local_50.OS = *(raw_ostream **)p_Var7;
          *(long *)p_Var7 = 0;
          local_58.Payload = EVar6.Payload;
          handleErrorImpl<llvm::logAllUnhandledErrors(llvm::Error,llvm::raw_ostream&,llvm::Twine)::__0>
                    ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                     &local_68,&local_50);
          ErrorList::join((ErrorList *)&local_48,&local_58,&local_68);
          aVar5.OS = local_48.OS;
          local_48.OS = (raw_ostream *)0x0;
          if ((long *)((ulong)local_68.Payload & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)((ulong)local_68.Payload & 0xfffffffffffffffe) + 8))();
          }
          if (local_50.OS != (raw_ostream *)0x0) {
            (*(local_50.OS)->_vptr_raw_ostream[1])();
          }
          local_50.OS = (raw_ostream *)0x0;
          if ((long *)((ulong)local_58.Payload & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)((ulong)local_58.Payload & 0xfffffffffffffffe) + 8))();
          }
          EVar6.Payload = (ErrorInfoBase *)((ulong)aVar5.OS | 1);
          p_Var7 = p_Var7 + 8;
          aVar5.OS = (raw_ostream *)local_40;
        } while (p_Var7 != p_Var1);
      }
      local_38.Payload = EVar6.Payload;
      pEVar4 = (((pointer)aVar5.OS)->_M_t).
               super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
               .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
    }
    (*(code *)pEVar4[1]._vptr_ErrorInfoBase)(aVar5.OS);
  }
LAB_00d95306:
  cantFail(&local_38,(char *)0x0);
  if ((long *)((ulong)local_38.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_38.Payload & 0xfffffffffffffffe) + 8))();
  }
  return;
}

Assistant:

void logAllUnhandledErrors(Error E, raw_ostream &OS, Twine ErrorBanner) {
  if (!E)
    return;
  OS << ErrorBanner;
  handleAllErrors(std::move(E), [&](const ErrorInfoBase &EI) {
    EI.log(OS);
    OS << "\n";
  });
}